

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadmap.cpp
# Opt level: O0

char * lm_addr_to_module(void *addr)

{
  bool bVar1;
  FILE *__stream;
  __ssize_t _Var2;
  char *pcVar3;
  void *in_RDI;
  lm_seg_t s;
  FILE *loadmap;
  size_t len;
  char *line;
  char *in_stack_ffffffffffffffa8;
  lm_seg_t *in_stack_ffffffffffffffb0;
  size_t local_20;
  char *local_18;
  void *local_10;
  
  local_18 = (char *)0x0;
  local_20 = 0;
  local_10 = in_RDI;
  __stream = fopen("/proc/self/maps","r");
  do {
    _Var2 = getline(&local_18,&local_20,__stream);
    if (_Var2 == -1) {
      return (char *)0x0;
    }
    lm_segment_parse(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    bVar1 = lm_segment_contains((lm_seg_t *)&stack0xffffffffffffef90,local_10);
  } while (!bVar1);
  pcVar3 = lm_segment_path((lm_seg_t *)&stack0xffffffffffffef90);
  pcVar3 = strdup(pcVar3);
  return pcVar3;
}

Assistant:

const char *
lm_addr_to_module
(
  void *addr
)
{
  char *line = NULL;
  size_t len = 0;

  FILE* loadmap = fopen("/proc/self/maps", "r");

  for(; getline(&line, &len, loadmap) != -1;) {
    lm_seg_t s;
    lm_segment_parse(&s, line);
    if (lm_segment_contains(&s, addr)) return strdup(lm_segment_path(&s));
  }
  return NULL;
}